

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_reader.cc
# Opt level: O2

intmax_t __thiscall pstack::Dwarf::DWARFReader::readFormSigned(DWARFReader *this,Form form)

{
  ostringstream *this_00;
  Exception *this_01;
  Exception local_1c8;
  
  this_01 = (Exception *)__cxa_allocate_exception(0x1a0);
  memset(&local_1c8,0,0x1a0);
  Exception::Exception(&local_1c8);
  this_00 = &local_1c8.str;
  std::operator<<((ostream *)this_00,"unhandled form ");
  std::ostream::operator<<(this_00,form);
  std::operator<<((ostream *)this_00," when reading signed");
  Exception::Exception(this_01,&local_1c8);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

intmax_t
DWARFReader::readFormSigned(Form form)
{
    (void)this; // avoid warnings about making this static.
    switch (form) {
        default:
            throw (Exception() << "unhandled form " << form << " when reading signed");
    }
}